

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint8_t uVar1;
  ushort key;
  shared_container_t *container;
  roaring_array_t *prVar2;
  uint uVar3;
  _Bool _Var4;
  container_t *c;
  ushort *puVar5;
  uint uVar6;
  uint start_index;
  uint uVar7;
  uint16_t uVar8;
  uint end_index;
  uint8_t type2;
  uint8_t result_type;
  uint local_4c;
  container_t *local_48;
  roaring_array_t *local_40;
  container_t *local_38;
  uint i;
  
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x3e2f,
                  "void roaring_bitmap_xor_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)");
  }
  result_type = '\0';
  end_index = (x2->high_low_container).size;
  if (end_index == 0) {
    return;
  }
  uVar7 = (x1->high_low_container).size;
  if (uVar7 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  uVar8 = *(x1->high_low_container).keys;
  puVar5 = (x2->high_low_container).keys;
  start_index = 0;
  i = 0;
  local_40 = &x2->high_low_container;
LAB_001121f0:
  do {
    prVar2 = local_40;
    key = *puVar5;
    while( true ) {
      uVar6 = i + 1;
      if (uVar8 == key) break;
      if (key <= uVar8) {
        local_48 = (container_t *)CONCAT44(local_48._4_4_,end_index);
        type2 = local_40->typecodes[start_index & 0xffff];
        local_4c = start_index;
        c = get_copy_of_container
                      (local_40->containers[start_index & 0xffff],&type2,
                       (_Bool)(local_40->flags & 1));
        uVar1 = type2;
        if ((prVar2->flags & 1) != 0) {
          local_38 = c;
          ra_set_container_at_index(local_40,local_4c,c,type2);
          c = local_38;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,i,key,c,uVar1);
        uVar7 = uVar7 + 1;
        start_index = local_4c + 1;
        end_index = (uint)local_48;
        uVar3 = (uint)local_48;
        if (start_index == (uint)local_48) goto LAB_001123cd;
        puVar5 = (ushort *)((ulong)((start_index & 0xffff) * 2) + (long)local_40->keys);
        i = uVar6;
        goto LAB_001121f0;
      }
      if (uVar7 == uVar6) goto LAB_001123d2;
      uVar8 = (x1->high_low_container).keys[uVar6 & 0xffff];
      i = uVar6;
    }
    uVar1 = (x1->high_low_container).typecodes[i & 0xffff];
    container = (shared_container_t *)(x1->high_low_container).containers[i & 0xffff];
    type2 = local_40->typecodes[start_index & 0xffff];
    if (uVar1 == '\x04') {
      local_4c = start_index;
      local_48 = container_xor(container,'\x04',local_40->containers[start_index & 0xffff],type2,
                               &result_type);
      shared_container_free(container);
    }
    else {
      local_4c = start_index;
      local_48 = container_ixor(container,uVar1,local_40->containers[start_index & 0xffff],type2,
                                &result_type);
    }
    uVar1 = result_type;
    _Var4 = container_nonzero_cardinality(local_48,result_type);
    if (_Var4) {
      ra_set_container_at_index(&x1->high_low_container,i,local_48,uVar1);
      i = uVar6;
    }
    else {
      container_free(local_48,uVar1);
      ra_remove_at_index(&x1->high_low_container,i);
      uVar7 = uVar7 - 1;
    }
    start_index = local_4c + 1;
    uVar6 = i;
    uVar3 = start_index;
    if ((i == uVar7) || (start_index == end_index)) {
LAB_001123cd:
      start_index = uVar3;
      if (uVar6 != uVar7) {
        return;
      }
LAB_001123d2:
      ra_append_copy_range
                (&x1->high_low_container,local_40,start_index,end_index,(_Bool)(local_40->flags & 1)
                );
      return;
    }
    uVar8 = (x1->high_low_container).keys[i & 0xffff];
    puVar5 = (ushort *)((ulong)((start_index & 0xffff) * 2) + (long)local_40->keys);
  } while( true );
}

Assistant:

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }

    // XOR can have new containers inserted from x2, but can also
    // lose containers when x1 and x2 are nonempty and identical.

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // so release
            }
            else {
                c = container_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }

            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}